

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRboStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_1::RboComponentSizeDepthCase::test
          (RboComponentSizeDepthCase *this)

{
  bool bVar1;
  qpTestResult qVar2;
  int *piVar3;
  TestLog *this_00;
  MessageBuilder *pMVar4;
  MessageBuilder local_1e8;
  undefined1 local_68 [8];
  StateQueryMemoryWriteGuard<int> state;
  int ndx;
  DepthFormat requiredDepthFormats [5];
  GLuint local_14;
  RboComponentSizeDepthCase *pRStack_10;
  GLuint renderbufferID;
  RboComponentSizeDepthCase *this_local;
  
  local_14 = 0;
  pRStack_10 = this;
  glu::CallLogWrapper::glGenRenderbuffers(&(this->super_ApiCase).super_CallLogWrapper,1,&local_14);
  glu::CallLogWrapper::glBindRenderbuffer
            (&(this->super_ApiCase).super_CallLogWrapper,0x8d41,local_14);
  ApiCase::expectError(&this->super_ApiCase,0);
  memcpy(&state.m_postguard,&DAT_02bbc000,0x3c);
  for (state.m_value = 0; state.m_value < 5; state.m_value = state.m_value + 1) {
    glu::CallLogWrapper::glRenderbufferStorage
              (&(this->super_ApiCase).super_CallLogWrapper,0x8d41,
               (&state)[state.m_value].m_postguard,0x80,0x80);
    ApiCase::expectError(&this->super_ApiCase,0);
    checkRenderbufferComponentSize
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               &(this->super_ApiCase).super_CallLogWrapper,-1,-1,-1,-1,
               requiredDepthFormats[(long)state.m_value + -1].sbits,
               requiredDepthFormats[state.m_value].internalFormat);
  }
  glu::CallLogWrapper::glRenderbufferStorage
            (&(this->super_ApiCase).super_CallLogWrapper,0x8d41,0x8d48,0x80,0x80);
  ApiCase::expectError(&this->super_ApiCase,0);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int> *)local_68);
  piVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                     ((StateQueryMemoryWriteGuard<int> *)local_68);
  glu::CallLogWrapper::glGetRenderbufferParameteriv
            (&(this->super_ApiCase).super_CallLogWrapper,0x8d41,0x8d55,piVar3);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    ((StateQueryMemoryWriteGuard<int> *)local_68,
                     (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  if ((bVar1) &&
     (piVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                         ((StateQueryMemoryWriteGuard *)local_68), *piVar3 < 8)) {
    this_00 = tcu::TestContext::getLog
                        ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                         m_testCtx);
    tcu::TestLog::operator<<(&local_1e8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_1e8,(char (*) [47])"// ERROR: Expected greater or equal to 8; got ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(StateQueryMemoryWriteGuard<int> *)local_68);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1e8);
    qVar2 = tcu::TestContext::getTestResult
                      ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
    ;
    if (qVar2 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult
                ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_FAIL,"got invalid value");
    }
  }
  glu::CallLogWrapper::glDeleteRenderbuffers
            (&(this->super_ApiCase).super_CallLogWrapper,1,&local_14);
  return;
}

Assistant:

void test (void)
	{
		using tcu::TestLog;

		GLuint renderbufferID = 0;
		glGenRenderbuffers(1, &renderbufferID);
		glBindRenderbuffer(GL_RENDERBUFFER, renderbufferID);
		expectError(GL_NO_ERROR);

		const struct DepthFormat
		{
			GLenum	internalFormat;
			int		dbits;
			int		sbits;
		} requiredDepthFormats[] =
		{
			{ GL_DEPTH_COMPONENT16,		16, 0 },
			{ GL_DEPTH_COMPONENT24,		24, 0 },
			{ GL_DEPTH_COMPONENT32F,	32, 0 },
			{ GL_DEPTH24_STENCIL8,		24, 8 },
			{ GL_DEPTH32F_STENCIL8,		32, 8 },
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(requiredDepthFormats); ++ndx)
		{
			glRenderbufferStorage(GL_RENDERBUFFER, requiredDepthFormats[ndx].internalFormat, 128, 128);
			expectError(GL_NO_ERROR);

			checkRenderbufferComponentSize(m_testCtx, *this, -1, -1, -1, -1, requiredDepthFormats[ndx].dbits, requiredDepthFormats[ndx].sbits);
		}

		// STENCIL_INDEX8 is required, in that case sBits >= 8
		{
			glRenderbufferStorage(GL_RENDERBUFFER, GL_STENCIL_INDEX8, 128, 128);
			expectError(GL_NO_ERROR);

			StateQueryMemoryWriteGuard<GLint> state;
			glGetRenderbufferParameteriv(GL_RENDERBUFFER, GL_RENDERBUFFER_STENCIL_SIZE, &state);

			if (state.verifyValidity(m_testCtx) && state < 8)
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected greater or equal to 8; got " << state << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid value");
			}
		}

		glDeleteRenderbuffers(1, &renderbufferID);
	}